

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1TruncateUnsafe(PCache1 *pCache,uint iLimit)

{
  PgHdr1 *pPage_00;
  PgHdr1 *pPage;
  PgHdr1 **pp;
  uint local_18;
  uint iStop;
  uint h;
  uint iLimit_local;
  PCache1 *pCache_local;
  
  if (pCache->iMaxKey - iLimit < pCache->nHash) {
    local_18 = iLimit % pCache->nHash;
    pp._4_4_ = pCache->iMaxKey % pCache->nHash;
  }
  else {
    local_18 = pCache->nHash >> 1;
    pp._4_4_ = local_18 - 1;
  }
  while( true ) {
    pPage = (PgHdr1 *)(pCache->apHash + local_18);
    while (pPage_00 = (PgHdr1 *)(pPage->page).pBuf, pPage_00 != (PgHdr1 *)0x0) {
      if (pPage_00->iKey < iLimit) {
        pPage = (PgHdr1 *)&pPage_00->pNext;
      }
      else {
        pCache->nPage = pCache->nPage - 1;
        (pPage->page).pBuf = pPage_00->pNext;
        if (pPage_00->pLruNext != (PgHdr1 *)0x0) {
          pcache1PinPage(pPage_00);
        }
        pcache1FreePage(pPage_00);
      }
    }
    if (local_18 == pp._4_4_) break;
    local_18 = (local_18 + 1) % pCache->nHash;
  }
  return;
}

Assistant:

static void pcache1TruncateUnsafe(
  PCache1 *pCache,             /* The cache to truncate */
  unsigned int iLimit          /* Drop pages with this pgno or larger */
){
  TESTONLY( int nPage = 0; )  /* To assert pCache->nPage is correct */
  unsigned int h, iStop;
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  assert( pCache->iMaxKey >= iLimit );
  assert( pCache->nHash > 0 );
  if( pCache->iMaxKey - iLimit < pCache->nHash ){
    /* If we are just shaving the last few pages off the end of the
    ** cache, then there is no point in scanning the entire hash table.
    ** Only scan those hash slots that might contain pages that need to
    ** be removed. */
    h = iLimit % pCache->nHash;
    iStop = pCache->iMaxKey % pCache->nHash;
    TESTONLY( nPage = -10; )  /* Disable the pCache->nPage validity check */
  }else{
    /* This is the general case where many pages are being removed.
    ** It is necessary to scan the entire hash table */
    h = pCache->nHash/2;
    iStop = h - 1;
  }
  for(;;){
    PgHdr1 **pp;
    PgHdr1 *pPage;
    assert( h<pCache->nHash );
    pp = &pCache->apHash[h]; 
    while( (pPage = *pp)!=0 ){
      if( pPage->iKey>=iLimit ){
        pCache->nPage--;
        *pp = pPage->pNext;
        if( PAGE_IS_UNPINNED(pPage) ) pcache1PinPage(pPage);
        pcache1FreePage(pPage);
      }else{
        pp = &pPage->pNext;
        TESTONLY( if( nPage>=0 ) nPage++; )
      }
    }
    if( h==iStop ) break;
    h = (h+1) % pCache->nHash;
  }
  assert( nPage<0 || pCache->nPage==(unsigned)nPage );
}